

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

int ma_strcpy_s(char *dst,size_t dstSizeInBytes,char *src)

{
  bool bVar1;
  size_t i;
  char *src_local;
  size_t dstSizeInBytes_local;
  char *dst_local;
  int local_4;
  
  if (dst == (char *)0x0) {
    local_4 = 0x16;
  }
  else if (dstSizeInBytes == 0) {
    local_4 = 0x22;
  }
  else if (src == (char *)0x0) {
    *dst = '\0';
    local_4 = 0x16;
  }
  else {
    i = 0;
    while( true ) {
      bVar1 = false;
      if (i < dstSizeInBytes) {
        bVar1 = src[i] != '\0';
      }
      if (!bVar1) break;
      dst[i] = src[i];
      i = i + 1;
    }
    if (i < dstSizeInBytes) {
      dst[i] = '\0';
      local_4 = 0;
    }
    else {
      *dst = '\0';
      local_4 = 0x22;
    }
  }
  return local_4;
}

Assistant:

MA_API MA_NO_INLINE int ma_strcpy_s(char* dst, size_t dstSizeInBytes, const char* src)
{
    size_t i;

    if (dst == 0) {
        return 22;
    }
    if (dstSizeInBytes == 0) {
        return 34;
    }
    if (src == 0) {
        dst[0] = '\0';
        return 22;
    }

    for (i = 0; i < dstSizeInBytes && src[i] != '\0'; ++i) {
        dst[i] = src[i];
    }

    if (i < dstSizeInBytes) {
        dst[i] = '\0';
        return 0;
    }

    dst[0] = '\0';
    return 34;
}